

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * google::protobuf::internal::FixedParser<unsigned_int>
                 (void *object,char *ptr,ParseContext *ctx)

{
  long in_RSI;
  int size;
  char *in_stack_00000020;
  EpsCopyInputStream *in_stack_00000028;
  undefined8 local_8;
  
  ReadSize((char **)ctx);
  if (in_RSI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                        (in_stack_00000028,in_stack_00000020,object._4_4_,
                         (RepeatedField<unsigned_int> *)ptr);
  }
  return local_8;
}

Assistant:

const char* FixedParser(void* object, const char* ptr, ParseContext* ctx) {
  int size = ReadSize(&ptr);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  return ctx->ReadPackedFixed(ptr, size,
                              static_cast<RepeatedField<T>*>(object));
}